

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

int refs_are_one_sided(AV1_COMMON *cm)

{
  int b;
  int iVar1;
  long in_RDI;
  RefCntBuffer *buf;
  int ref;
  int cur_display_order_hint;
  int one_sided_refs;
  MV_REFERENCE_FRAME in_stack_ffffffffffffffdf;
  AV1_COMMON *in_stack_ffffffffffffffe0;
  int local_14;
  
  b = *(int *)(in_RDI + 8);
  local_14 = 1;
  while( true ) {
    if (7 < local_14) {
      return 1;
    }
    in_stack_ffffffffffffffe0 =
         (AV1_COMMON *)get_ref_frame_buf(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
    if ((in_stack_ffffffffffffffe0 != (AV1_COMMON *)0x0) &&
       (iVar1 = av1_encoder_get_relative_dist
                          ((in_stack_ffffffffffffffe0->current_frame).refresh_frame_flags,b),
       0 < iVar1)) break;
    local_14 = local_14 + 1;
  }
  return 0;
}

Assistant:

static inline int refs_are_one_sided(const AV1_COMMON *cm) {
  assert(!frame_is_intra_only(cm));

  int one_sided_refs = 1;
  const int cur_display_order_hint = cm->current_frame.display_order_hint;
  for (int ref = LAST_FRAME; ref <= ALTREF_FRAME; ++ref) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref);
    if (buf == NULL) continue;
    if (av1_encoder_get_relative_dist(buf->display_order_hint,
                                      cur_display_order_hint) > 0) {
      one_sided_refs = 0;  // bwd reference
      break;
    }
  }
  return one_sided_refs;
}